

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void testing::Mock::UnregisterCallReaction(void *mock_obj)

{
  MutexLock l;
  MutexBase *in_stack_ffffffffffffffd8;
  map<const_void_*,_testing::internal::CallReaction,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::internal::CallReaction>_>_>
  *in_stack_ffffffffffffffe0;
  
  internal::GTestMutexLock::GTestMutexLock
            ((GTestMutexLock *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::
  map<const_void_*,_testing::internal::CallReaction,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::internal::CallReaction>_>_>
  ::erase(in_stack_ffffffffffffffe0,(key_type *)in_stack_ffffffffffffffd8);
  internal::GTestMutexLock::~GTestMutexLock((GTestMutexLock *)0x129b27);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(internal::g_gmock_mutex) {
  internal::MutexLock l(&internal::g_gmock_mutex);
  g_uninteresting_call_reaction.erase(mock_obj);
}